

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

uint32 __thiscall Process::start(Process *this,String *commandLine,Map<String,_String> *environment)

{
  ItemBlock *pIVar1;
  long lVar2;
  undefined1 auVar3 [8];
  uint32 uVar4;
  int *piVar5;
  char *pcVar6;
  ulong uVar7;
  Iterator IVar8;
  char **argv;
  char *apcStack_d0 [2];
  undefined1 local_c0 [8];
  List<String> command;
  
  if (this->pid == 0) {
    local_c0 = (undefined1  [8])&command._size;
    command._begin.item = (Item *)0x0;
    command._size = (usize)&String::emptyData;
    command.endItem.value._data.ref = 0;
    command.endItem.prev = (Item *)0x0;
    command.endItem.next = (Item *)0x0;
    command.freeItem = (Item *)0x0;
    apcStack_d0[0] = (char *)0x109cd8;
    command._end.item = (Item *)local_c0;
    Private::splitCommandLine(commandLine,(List<String> *)local_c0);
    if (command.endItem.value._data.ref == 0) {
      command.blocks = (ItemBlock *)&String::emptyData;
      apcStack_d0[0] = (char *)0x109d90;
      List<String>::insert((List<String> *)local_c0,(Iterator *)local_c0,(String *)&command.blocks);
      if (command.blocks[3].next != (ItemBlock *)0x0) {
        LOCK();
        pIVar1 = command.blocks + 3;
        pIVar1->next = (ItemBlock *)((long)&pIVar1->next[-1].next + 7);
        UNLOCK();
        if ((pIVar1->next == (ItemBlock *)0x0) && (command.blocks != (ItemBlock *)0x0)) {
          apcStack_d0[0] = (char *)0x109dbc;
          operator_delete__(command.blocks);
        }
      }
    }
    auVar3 = local_c0;
    lVar2 = -((long)command._begin.item * 8 + 0x17U & 0xfffffffffffffff0);
    argv = (char **)((long)apcStack_d0 + lVar2 + 8);
    uVar7 = 0;
    if ((undefined1  [8])command._end.item != local_c0) {
      uVar7 = 0;
      IVar8.item = command._end.item;
      do {
        *(undefined8 *)((long)apcStack_d0 + lVar2) = 0x109d24;
        pcVar6 = String::operator_cast_to_char_(&(IVar8.item)->value);
        argv[uVar7] = pcVar6;
        uVar7 = uVar7 + 1;
        IVar8.item = (IVar8.item)->next;
      } while ((undefined1  [8])IVar8.item != auVar3);
    }
    argv[uVar7 & 0xffffffff] = (char *)0x0;
    IVar8 = command._end;
    *(undefined8 *)((long)apcStack_d0 + lVar2) = 0x109d5b;
    uVar4 = start(this,&(IVar8.item)->value,(int)uVar7 + 1,argv,environment);
    *(undefined8 *)((long)apcStack_d0 + lVar2) = 0x109d69;
    List<String>::~List((List<String> *)local_c0);
  }
  else {
    apcStack_d0[0] = (char *)0x109c87;
    piVar5 = __errno_location();
    *piVar5 = 0x16;
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

uint32 Process::start(const String& commandLine, const Map<String, String>& environment)
{
#ifdef _WIN32
  if(hProcess != INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return 0;
  }

  STARTUPINFO si;
  PROCESS_INFORMATION pi;

  ZeroMemory(&si, sizeof(si));
  si.cb = sizeof(si);
  ZeroMemory(&pi, sizeof(pi));

  LPTSTR env = NULL;
  Buffer envBuffer;
  if (!environment.isEmpty())
  {
    usize bufferSize = 1;
    for (Map<String, String>::Iterator i = environment.begin(); i != environment.end(); ++i)
    {
      const String& key = i.key();
      const String& val = *i;
      if (key.isEmpty() || val.isEmpty())
          continue;
      bufferSize += key.length() + val.length() + 2;
    }
    envBuffer.reserve(bufferSize * sizeof(char));
    LPTSTR lptEnv = (LPTSTR)(byte*)envBuffer;
    env = lptEnv;
    for (Map<String, String>::Iterator i = environment.begin(); i != environment.end(); ++i)
    {
      const String& key = i.key();
      const String& val = *i;
      if (key.isEmpty() || val.isEmpty())
        continue;
      memcpy(lptEnv, (const char*)key, key.length() * sizeof(char));
      lptEnv += key.length();
      *(lptEnv++) = '=';
      memcpy(lptEnv, (const char*)val, val.length() * sizeof(char));
      lptEnv += val.length();
      *(lptEnv++) = '\0';
    }
    *lptEnv = '\0';
  }

  String args(commandLine);
  if(!CreateProcess(NULL, (char*)args, NULL, NULL, FALSE, 
#ifdef UNICODE
      CREATE_UNICODE_ENVIRONMENT
#else
      0
#endif
      , env, NULL, &si, &pi))
    return 0;

  CloseHandle(pi.hThread);

  ASSERT(pi.hProcess);
  hProcess = pi.hProcess;
  pid = pi.dwProcessId;

  return pi.dwProcessId;

#else
  if(pid)
  {
    errno = EINVAL;
    return false;
  }

  List<String> command;
  Private::splitCommandLine(commandLine, command);
  if(command.isEmpty())
    command.append(String());

  char** argv = (char**)alloca(sizeof(char*) * (command.size() + 1));
  int i = 0;
  for (List<String>::Iterator j = command.begin(), end = command.end(); j != end; ++j)
    argv[i++] = (char*)(const char*)*j;
  argv[i] = 0;
  return start(command.front(), i + 1, argv, environment);
#endif
}